

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::ToggleCameraView(LTAircraft *this)

{
  bool bVar1;
  LTAircraft *in_RDI;
  undefined4 in_stack_00000008;
  XPViewTypes in_stack_0000000c;
  LTAircraft *in_stack_00000030;
  
  extOffs.roll = 0.0;
  extOffs.heading = 0.0;
  extOffs.z = 0.0;
  extOffs.y = 0.0;
  extOffs.x = 0.0;
  extOffs.zoom = 1.0;
  extOffs.pitch = -5.0;
  if (pExtViewAc == (LTAircraft *)0x0) {
    pExtViewAc = in_RDI;
    bVar1 = DataRefs::ShallUseExternalCamera(&dataRefs);
    if (!bVar1) {
      CalcCameraViewPos(in_stack_00000030);
      bVar1 = DataRefs::IsViewExternal((DataRefs *)0x195efa);
      if (bVar1) {
        prevView = VIEW_UNKNOWN;
      }
      else {
        prevView = DataRefs::GetViewType((DataRefs *)0x195f0a);
        DataRefs::SetViewType((DataRefs *)this,in_stack_0000000c);
      }
      XPLMControlCamera(1,CameraCB,0);
      CameraRegisterCommands(false);
    }
  }
  else if (pExtViewAc == in_RDI) {
    pExtViewAc = (LTAircraft *)0x0;
    bVar1 = DataRefs::ShallUseExternalCamera(&dataRefs);
    if (!bVar1) {
      CameraRegisterCommands(false);
      XPLMDontControlCamera();
      if (prevView != VIEW_UNKNOWN) {
        DataRefs::SetViewType((DataRefs *)this,in_stack_0000000c);
        prevView = VIEW_UNKNOWN;
      }
    }
  }
  else {
    pExtViewAc = in_RDI;
    CalcCameraViewPos(in_stack_00000030);
  }
  DataRefs::SetCameraAc
            ((DataRefs *)this,(LTAircraft *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  return;
}

Assistant:

void LTAircraft::ToggleCameraView()
{
    // reset camera offset
    extOffs.x = extOffs.y = extOffs.z = extOffs.heading = extOffs.roll = 0.0f;
    extOffs.zoom = 1.0f;
    extOffs.pitch = MDL_EXT_CAMERA_PITCH;

    // starting a new external view?
    if (!pExtViewAc) {
        pExtViewAc = this;                          // remember ourself as the aircraft to show
        if (!dataRefs.ShallUseExternalCamera()) {
            CalcCameraViewPos();                    // calc first position

            // we shall ensure to set an external view first,
            // so that sound and 2D stuff is handled correctly
            if (!dataRefs.IsViewExternal()) {
                prevView = dataRefs.GetViewType();
                dataRefs.SetViewType(VIEW_FREE_CAM);
            }
            else
                prevView = VIEW_UNKNOWN;

            XPLMControlCamera(xplm_ControlCameraUntilViewChanges, CameraCB, nullptr);
            CameraRegisterCommands(true);
        }
    }
    else if (pExtViewAc == this) {      // me again? -> switch off
        pExtViewAc = nullptr;
        if (!dataRefs.ShallUseExternalCamera()) {
            CameraRegisterCommands(false);
            XPLMDontControlCamera();

            // if a previous view is known we make sure we go back there
            if (prevView) {
                dataRefs.SetViewType(prevView);
                prevView = VIEW_UNKNOWN;
            }
        }
    }
    else {                              // view another plane
        pExtViewAc = this;
        CalcCameraViewPos();
    }
    
    // Inform 3rd party camera plugins
    dataRefs.SetCameraAc(pExtViewAc);
}